

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double english_letter_pdf(char c)

{
  int iVar1;
  undefined3 in_register_00000039;
  
  iVar1 = -0x61;
  if (0x19 < (byte)(c + 0x9fU)) {
    if (0x19 < (byte)(c + 0xbfU)) {
      return 0.0;
    }
    iVar1 = -0x41;
  }
  return *(double *)(&DAT_0021cb80 + (ulong)(uint)(iVar1 + CONCAT31(in_register_00000039,c)) * 8);
}

Assistant:

double english_letter_pdf ( char c )

//****************************************************************************80
//
//  Purpose:
//
//    ENGLISH_LETTER_PDF evaluates the English Letter PDF.
//
//  Discussion:
//
//    PDF('c') = 0.02782
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    06 March 2016
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Robert Lewand,
//    Cryptological Mathematics,
//    Mathematics Association of America, 2000,
//    ISBN13: 978-0883857199
//
//  Parameters:
//
//    Input, char C, the letter whose probability is desired.
//    'a' <= c <= 'z', but case is ignored.
//
//    Output, double ENGLISH_LETTER_PDF, the value of the PDF.
//
{
  int i;
  double pdf;
  double pdf_vec[26] = {
    0.08167, 0.01492, 0.02782, 0.04253, 0.12702, 
    0.02228, 0.02015, 0.06094, 0.06966, 0.00153, 
    0.00772, 0.04025, 0.02406, 0.06749, 0.07507, 
    0.01929, 0.00095, 0.05987, 0.06327, 0.09056, 
    0.02758, 0.00978, 0.02361, 0.00150, 0.01974, 
    0.00074 };

  if ( 'a' <= c && c <= 'z' )
  {
    i = c - 'a';
    pdf = pdf_vec[i];
  }
  else if ( 'A' <= c && c <= 'Z' )
  {
    i = c - 'A';
    pdf = pdf_vec[i];
  }
  else
  {
    pdf = 0.0;
  }

  return pdf;
}